

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::ScalarReplacementPass::CheckStore
          (ScalarReplacementPass *this,Instruction *inst,uint32_t index)

{
  uint32_t uVar1;
  uint32_t index_local;
  Instruction *inst_local;
  ScalarReplacementPass *this_local;
  
  if (index == 0) {
    uVar1 = opt::Instruction::NumInOperands(inst);
    if ((2 < uVar1) && (uVar1 = opt::Instruction::GetSingleWordInOperand(inst,2), (uVar1 & 1) != 0))
    {
      return false;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ScalarReplacementPass::CheckStore(const Instruction* inst,
                                       uint32_t index) const {
  if (index != 0u) return false;
  if (inst->NumInOperands() >= 3 &&
      inst->GetSingleWordInOperand(2u) &
          uint32_t(spv::MemoryAccessMask::Volatile))
    return false;
  return true;
}